

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O2

void __thiscall
MedianFilterCV_8U::setSourceImage(MedianFilterCV_8U *this,uchar **matrix,int rows,int cols)

{
  int j;
  Mat *pMVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pMVar1 = this->sourceImage;
  if (pMVar1 != (Mat *)0x0) {
    cv::Mat::~Mat(pMVar1);
  }
  operator_delete(pMVar1,0x60);
  pMVar1 = (Mat *)operator_new(0x60);
  uVar4 = 0;
  cv::Mat::Mat(pMVar1,rows,cols,0);
  uVar3 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar3 = uVar4;
  }
  this->sourceImage = pMVar1;
  uVar5 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      *(ushort *)(**(long **)(pMVar1 + 0x48) * uVar4 + *(long *)(pMVar1 + 0x10) + uVar2 * 2) =
           (ushort)matrix[uVar4][uVar2];
    }
  }
  return;
}

Assistant:

void MedianFilterCV_8U::setSourceImage(const uchar **matrix, int rows, int cols) {
    delete sourceImage;

    sourceImage = new cv::Mat(rows, cols, CV_8U);
    for (int i = 0; i < rows; ++i) {
        for (int j = 0; j < cols; ++j) {
            sourceImage->at<ushort>(i, j) = matrix[i][j];
        }
    }
}